

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Scene *pSVar12;
  Ref<embree::Geometry> *pRVar13;
  Geometry *pGVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  int iVar37;
  AABBNodeMB4D *node1;
  ulong uVar38;
  long lVar39;
  long lVar40;
  uint uVar41;
  ulong *puVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  vint4 bi;
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  vint4 ai;
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar94 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  uint uVar101;
  uint uVar102;
  uint uVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar100 [64];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_df8;
  RTCFilterFunctionNArguments local_d30;
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cb0 [16];
  undefined1 local_ca0 [16];
  undefined1 local_c90 [16];
  undefined1 local_c80 [16];
  undefined1 local_c70 [16];
  undefined1 local_c60 [16];
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_c40._4_4_ = fVar1;
  local_c40._0_4_ = fVar1;
  local_c40._8_4_ = fVar1;
  local_c40._12_4_ = fVar1;
  auVar79 = ZEXT1664(local_c40);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_c50._4_4_ = fVar2;
  local_c50._0_4_ = fVar2;
  local_c50._8_4_ = fVar2;
  local_c50._12_4_ = fVar2;
  auVar81 = ZEXT1664(local_c50);
  fVar104 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_c60._4_4_ = fVar104;
  local_c60._0_4_ = fVar104;
  local_c60._8_4_ = fVar104;
  local_c60._12_4_ = fVar104;
  auVar84 = ZEXT1664(local_c60);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar104 = fVar104 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar58 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_c70._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_c70._8_4_ = -fVar1;
  local_c70._12_4_ = -fVar1;
  auVar90 = ZEXT1664(local_c70);
  local_c80._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_c80._8_4_ = -fVar2;
  local_c80._12_4_ = -fVar2;
  auVar94 = ZEXT1664(local_c80);
  iVar37 = (tray->tnear).field_0.i[k];
  local_c90._4_4_ = iVar37;
  local_c90._0_4_ = iVar37;
  local_c90._8_4_ = iVar37;
  local_c90._12_4_ = iVar37;
  auVar100 = ZEXT1664(local_c90);
  local_ca0._0_8_ = CONCAT44(fVar104,fVar104) ^ 0x8000000080000000;
  local_ca0._8_4_ = -fVar104;
  local_ca0._12_4_ = -fVar104;
  auVar109 = ZEXT1664(local_ca0);
  iVar37 = (tray->tfar).field_0.i[k];
  local_cb0._4_4_ = iVar37;
  local_cb0._0_4_ = iVar37;
  local_cb0._8_4_ = iVar37;
  local_cb0._12_4_ = iVar37;
  auVar112 = ZEXT1664(local_cb0);
  local_b60._16_16_ = mm_lookupmask_ps._240_16_;
  local_b60._0_16_ = mm_lookupmask_ps._0_16_;
  iVar37 = 1 << ((uint)k & 0x1f);
  auVar88._4_4_ = iVar37;
  auVar88._0_4_ = iVar37;
  auVar88._8_4_ = iVar37;
  auVar88._12_4_ = iVar37;
  auVar88._16_4_ = iVar37;
  auVar88._20_4_ = iVar37;
  auVar88._24_4_ = iVar37;
  auVar88._28_4_ = iVar37;
  auVar67 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar88 = vpand_avx2(auVar88,auVar67);
  local_ba0 = vpcmpeqd_avx2(auVar88,auVar67);
  auVar70._8_4_ = 0x3f800000;
  auVar70._0_8_ = 0x3f8000003f800000;
  auVar70._12_4_ = 0x3f800000;
  auVar70._16_4_ = 0x3f800000;
  auVar70._20_4_ = 0x3f800000;
  auVar70._24_4_ = 0x3f800000;
  auVar70._28_4_ = 0x3f800000;
  auVar67._8_4_ = 0xbf800000;
  auVar67._0_8_ = 0xbf800000bf800000;
  auVar67._12_4_ = 0xbf800000;
  auVar67._16_4_ = 0xbf800000;
  auVar67._20_4_ = 0xbf800000;
  auVar67._24_4_ = 0xbf800000;
  auVar67._28_4_ = 0xbf800000;
  local_b80 = vblendvps_avx(auVar70,auVar67,local_b60);
  local_df8 = local_7f8;
LAB_0160d34d:
  do {
    puVar42 = local_df8;
    if (puVar42 == &local_800) {
LAB_0160df9f:
      return puVar42 != &local_800;
    }
    local_df8 = puVar42 + -1;
    uVar46 = puVar42[-1];
    while ((uVar46 & 8) == 0) {
      uVar38 = uVar46 & 0xfffffffffffffff0;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar64._4_4_ = uVar3;
      auVar64._0_4_ = uVar3;
      auVar64._8_4_ = uVar3;
      auVar64._12_4_ = uVar3;
      auVar65 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar49),auVar64,
                                *(undefined1 (*) [16])(uVar38 + 0x20 + uVar49));
      auVar65 = vfmadd213ps_fma(auVar65,auVar79._0_16_,auVar90._0_16_);
      auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar58),auVar64,
                                *(undefined1 (*) [16])(uVar38 + 0x20 + uVar58));
      auVar26 = vfmadd213ps_fma(auVar26,auVar81._0_16_,auVar94._0_16_);
      auVar65 = vpmaxsd_avx(auVar65,auVar26);
      auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar47),auVar64,
                                *(undefined1 (*) [16])(uVar38 + 0x20 + uVar47));
      auVar26 = vfmadd213ps_fma(auVar26,auVar84._0_16_,auVar109._0_16_);
      auVar26 = vpmaxsd_avx(auVar26,auVar100._0_16_);
      auVar65 = vpmaxsd_avx(auVar65,auVar26);
      auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + (uVar49 ^ 0x10)),auVar64,
                                *(undefined1 (*) [16])(uVar38 + 0x20 + (uVar49 ^ 0x10)));
      auVar26 = vfmadd213ps_fma(auVar26,auVar79._0_16_,auVar90._0_16_);
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + (uVar58 ^ 0x10)),auVar64,
                                *(undefined1 (*) [16])(uVar38 + 0x20 + (uVar58 ^ 0x10)));
      auVar27 = vfmadd213ps_fma(auVar27,auVar81._0_16_,auVar94._0_16_);
      auVar26 = vpminsd_avx(auVar26,auVar27);
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + (uVar47 ^ 0x10)),auVar64,
                                *(undefined1 (*) [16])(uVar38 + 0x20 + (uVar47 ^ 0x10)));
      auVar27 = vfmadd213ps_fma(auVar27,auVar84._0_16_,auVar109._0_16_);
      auVar27 = vpminsd_avx(auVar27,auVar112._0_16_);
      auVar26 = vpminsd_avx(auVar26,auVar27);
      if (((uint)uVar46 & 7) == 6) {
        auVar26 = vcmpps_avx(auVar65,auVar26,2);
        auVar65 = vcmpps_avx(*(undefined1 (*) [16])(uVar38 + 0xe0),auVar64,2);
        auVar27 = vcmpps_avx(auVar64,*(undefined1 (*) [16])(uVar38 + 0xf0),1);
        auVar65 = vandps_avx(auVar65,auVar27);
        auVar65 = vandps_avx(auVar65,auVar26);
      }
      else {
        auVar65 = vcmpps_avx(auVar65,auVar26,2);
      }
      auVar65 = vpslld_avx(auVar65,0x1f);
      uVar41 = vmovmskps_avx(auVar65);
      if (uVar41 == 0) goto LAB_0160d34d;
      uVar41 = uVar41 & 0xff;
      lVar40 = 0;
      for (uVar46 = (ulong)uVar41; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
        lVar40 = lVar40 + 1;
      }
      uVar46 = *(ulong *)(uVar38 + lVar40 * 8);
      uVar41 = uVar41 - 1 & uVar41;
      uVar43 = (ulong)uVar41;
      if (uVar41 != 0) {
        do {
          *local_df8 = uVar46;
          local_df8 = local_df8 + 1;
          lVar40 = 0;
          for (uVar46 = uVar43; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
            lVar40 = lVar40 + 1;
          }
          uVar43 = uVar43 - 1 & uVar43;
          uVar46 = *(ulong *)(uVar38 + lVar40 * 8);
        } while (uVar43 != 0);
      }
    }
    uVar38 = uVar46 & 0xfffffffffffffff0;
    for (lVar40 = 0; lVar40 != (ulong)((uint)uVar46 & 0xf) - 8; lVar40 = lVar40 + 1) {
      lVar39 = lVar40 * 0x60;
      pSVar12 = context->scene;
      pRVar13 = (pSVar12->geometries).items;
      pGVar14 = pRVar13[*(uint *)(uVar38 + 0x40 + lVar39)].ptr;
      fVar1 = (pGVar14->time_range).lower;
      fVar1 = pGVar14->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar14->time_range).upper - fVar1));
      auVar65 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
      auVar65 = vminss_avx(auVar65,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
      auVar19 = vmaxss_avx(ZEXT816(0) << 0x20,auVar65);
      iVar37 = (int)auVar19._0_4_;
      lVar55 = (long)iVar37 * 0x38;
      lVar15 = *(long *)(*(long *)&pGVar14[2].numPrimitives + lVar55);
      uVar59 = (ulong)*(uint *)(uVar38 + 4 + lVar39);
      auVar65 = *(undefined1 (*) [16])(lVar15 + (ulong)*(uint *)(uVar38 + lVar39) * 4);
      uVar45 = (ulong)*(uint *)(uVar38 + 0x10 + lVar39);
      auVar26 = *(undefined1 (*) [16])(lVar15 + uVar45 * 4);
      uVar50 = (ulong)*(uint *)(uVar38 + 0x20 + lVar39);
      auVar27 = *(undefined1 (*) [16])(lVar15 + uVar50 * 4);
      uVar51 = (ulong)*(uint *)(uVar38 + 0x30 + lVar39);
      auVar64 = *(undefined1 (*) [16])(lVar15 + uVar51 * 4);
      lVar15 = *(long *)&pRVar13[*(uint *)(uVar38 + 0x44 + lVar39)].ptr[2].numPrimitives;
      lVar16 = *(long *)(lVar15 + lVar55);
      auVar5 = *(undefined1 (*) [16])(lVar16 + uVar59 * 4);
      uVar52 = (ulong)*(uint *)(uVar38 + 0x14 + lVar39);
      auVar66 = *(undefined1 (*) [16])(lVar16 + uVar52 * 4);
      uVar53 = (ulong)*(uint *)(uVar38 + 0x24 + lVar39);
      auVar6 = *(undefined1 (*) [16])(lVar16 + uVar53 * 4);
      uVar54 = (ulong)*(uint *)(uVar38 + 0x34 + lVar39);
      auVar7 = *(undefined1 (*) [16])(lVar16 + uVar54 * 4);
      lVar16 = *(long *)&pRVar13[*(uint *)(uVar38 + 0x48 + lVar39)].ptr[2].numPrimitives;
      lVar17 = *(long *)(lVar16 + lVar55);
      uVar48 = (ulong)*(uint *)(uVar38 + 8 + lVar39);
      auVar8 = *(undefined1 (*) [16])(lVar17 + uVar48 * 4);
      uVar60 = (ulong)*(uint *)(uVar38 + 0x18 + lVar39);
      auVar9 = *(undefined1 (*) [16])(lVar17 + uVar60 * 4);
      uVar61 = (ulong)*(uint *)(uVar38 + 0x28 + lVar39);
      auVar10 = *(undefined1 (*) [16])(lVar17 + uVar61 * 4);
      uVar62 = (ulong)*(uint *)(uVar38 + 0x38 + lVar39);
      auVar11 = *(undefined1 (*) [16])(lVar17 + uVar62 * 4);
      fVar1 = fVar1 - auVar19._0_4_;
      lVar17 = *(long *)&pRVar13[*(uint *)(uVar38 + 0x4c + lVar39)].ptr[2].numPrimitives;
      lVar55 = *(long *)(lVar17 + lVar55);
      uVar43 = (ulong)*(uint *)(uVar38 + 0xc + lVar39);
      auVar19 = *(undefined1 (*) [16])(lVar55 + uVar43 * 4);
      uVar56 = (ulong)*(uint *)(uVar38 + 0x1c + lVar39);
      auVar72 = *(undefined1 (*) [16])(lVar55 + uVar56 * 4);
      auVar80 = vunpcklps_avx(auVar65,auVar8);
      auVar8 = vunpckhps_avx(auVar65,auVar8);
      auVar92 = vunpcklps_avx(auVar5,auVar19);
      auVar5 = vunpckhps_avx(auVar5,auVar19);
      uVar57 = (ulong)*(uint *)(uVar38 + 0x2c + lVar39);
      auVar65 = *(undefined1 (*) [16])(lVar55 + uVar57 * 4);
      local_bc0 = vunpcklps_avx(auVar8,auVar5);
      local_c00 = vunpcklps_avx(auVar80,auVar92);
      local_be0 = vunpckhps_avx(auVar80,auVar92);
      auVar8 = vunpcklps_avx(auVar26,auVar9);
      auVar5 = vunpckhps_avx(auVar26,auVar9);
      auVar9 = vunpcklps_avx(auVar66,auVar72);
      auVar66 = vunpckhps_avx(auVar66,auVar72);
      uVar63 = (ulong)*(uint *)(uVar38 + 0x3c + lVar39);
      auVar26 = *(undefined1 (*) [16])(lVar55 + uVar63 * 4);
      local_bb0 = vunpcklps_avx(auVar5,auVar66);
      local_bf0 = vunpcklps_avx(auVar8,auVar9);
      local_bd0 = vunpckhps_avx(auVar8,auVar9);
      auVar66 = vunpcklps_avx(auVar27,auVar10);
      auVar27 = vunpckhps_avx(auVar27,auVar10);
      auVar8 = vunpcklps_avx(auVar6,auVar65);
      auVar5 = vunpckhps_avx(auVar6,auVar65);
      lVar44 = (long)(iVar37 + 1) * 0x38;
      lVar55 = *(long *)(*(long *)&pGVar14[2].numPrimitives + lVar44);
      auVar65 = *(undefined1 (*) [16])(lVar55 + (ulong)*(uint *)(uVar38 + lVar39) * 4);
      auVar6 = vunpcklps_avx(auVar27,auVar5);
      local_c20 = vunpcklps_avx(auVar66,auVar8);
      local_c10 = vunpckhps_avx(auVar66,auVar8);
      auVar5 = vunpcklps_avx(auVar64,auVar11);
      auVar27 = vunpckhps_avx(auVar64,auVar11);
      auVar66 = vunpcklps_avx(auVar7,auVar26);
      auVar64 = vunpckhps_avx(auVar7,auVar26);
      lVar16 = *(long *)(lVar16 + lVar44);
      auVar26 = *(undefined1 (*) [16])(lVar16 + uVar48 * 4);
      auVar7 = vunpcklps_avx(auVar27,auVar64);
      auVar8 = vunpcklps_avx(auVar5,auVar66);
      local_c30 = vunpckhps_avx(auVar5,auVar66);
      lVar15 = *(long *)(lVar15 + lVar44);
      auVar64 = vunpcklps_avx(auVar65,auVar26);
      auVar27 = vunpckhps_avx(auVar65,auVar26);
      auVar65 = *(undefined1 (*) [16])(lVar15 + uVar59 * 4);
      lVar17 = *(long *)(lVar17 + lVar44);
      auVar26 = *(undefined1 (*) [16])(lVar17 + uVar43 * 4);
      auVar5 = vunpcklps_avx(auVar65,auVar26);
      auVar65 = vunpckhps_avx(auVar65,auVar26);
      auVar9 = vunpcklps_avx(auVar27,auVar65);
      auVar10 = vunpcklps_avx(auVar64,auVar5);
      auVar27 = vunpckhps_avx(auVar64,auVar5);
      auVar65 = *(undefined1 (*) [16])(lVar55 + uVar45 * 4);
      auVar26 = *(undefined1 (*) [16])(lVar16 + uVar60 * 4);
      auVar5 = vunpcklps_avx(auVar65,auVar26);
      auVar64 = vunpckhps_avx(auVar65,auVar26);
      auVar65 = *(undefined1 (*) [16])(lVar15 + uVar52 * 4);
      auVar26 = *(undefined1 (*) [16])(lVar17 + uVar56 * 4);
      auVar66 = vunpcklps_avx(auVar65,auVar26);
      auVar65 = vunpckhps_avx(auVar65,auVar26);
      auVar11 = vunpcklps_avx(auVar64,auVar65);
      auVar19 = vunpcklps_avx(auVar5,auVar66);
      auVar64 = vunpckhps_avx(auVar5,auVar66);
      auVar65 = *(undefined1 (*) [16])(lVar55 + uVar50 * 4);
      auVar26 = *(undefined1 (*) [16])(lVar16 + uVar61 * 4);
      auVar66 = vunpcklps_avx(auVar65,auVar26);
      auVar5 = vunpckhps_avx(auVar65,auVar26);
      auVar65 = *(undefined1 (*) [16])(lVar15 + uVar53 * 4);
      auVar26 = *(undefined1 (*) [16])(lVar17 + uVar57 * 4);
      auVar72 = vunpcklps_avx(auVar65,auVar26);
      auVar65 = vunpckhps_avx(auVar65,auVar26);
      auVar80 = vunpcklps_avx(auVar5,auVar65);
      auVar92 = vunpcklps_avx(auVar66,auVar72);
      auVar5 = vunpckhps_avx(auVar66,auVar72);
      auVar65 = *(undefined1 (*) [16])(lVar55 + uVar51 * 4);
      auVar26 = *(undefined1 (*) [16])(lVar16 + uVar62 * 4);
      auVar72 = vunpcklps_avx(auVar65,auVar26);
      auVar66 = vunpckhps_avx(auVar65,auVar26);
      auVar65 = *(undefined1 (*) [16])(lVar15 + uVar54 * 4);
      auVar26 = *(undefined1 (*) [16])(lVar17 + uVar63 * 4);
      auVar69 = vunpcklps_avx(auVar65,auVar26);
      auVar65 = vunpckhps_avx(auVar65,auVar26);
      auVar26 = vunpcklps_avx(auVar66,auVar65);
      auVar66 = vunpcklps_avx(auVar72,auVar69);
      auVar65 = vunpckhps_avx(auVar72,auVar69);
      fVar2 = 1.0 - fVar1;
      auVar69._4_4_ = fVar2;
      auVar69._0_4_ = fVar2;
      auVar69._8_4_ = fVar2;
      auVar69._12_4_ = fVar2;
      auVar75._0_4_ = fVar1 * auVar10._0_4_;
      auVar75._4_4_ = fVar1 * auVar10._4_4_;
      auVar75._8_4_ = fVar1 * auVar10._8_4_;
      auVar75._12_4_ = fVar1 * auVar10._12_4_;
      auVar10 = vfmadd231ps_fma(auVar75,auVar69,local_c00);
      auVar82._0_4_ = fVar1 * auVar27._0_4_;
      auVar82._4_4_ = fVar1 * auVar27._4_4_;
      auVar82._8_4_ = fVar1 * auVar27._8_4_;
      auVar82._12_4_ = fVar1 * auVar27._12_4_;
      auVar27 = vfmadd231ps_fma(auVar82,auVar69,local_be0);
      auVar77._0_4_ = auVar9._0_4_ * fVar1;
      auVar77._4_4_ = auVar9._4_4_ * fVar1;
      auVar77._8_4_ = auVar9._8_4_ * fVar1;
      auVar77._12_4_ = auVar9._12_4_ * fVar1;
      auVar9 = vfmadd231ps_fma(auVar77,auVar69,local_bc0);
      auVar72._0_4_ = fVar1 * auVar19._0_4_;
      auVar72._4_4_ = fVar1 * auVar19._4_4_;
      auVar72._8_4_ = fVar1 * auVar19._8_4_;
      auVar72._12_4_ = fVar1 * auVar19._12_4_;
      auVar19 = vfmadd231ps_fma(auVar72,auVar69,local_bf0);
      auVar85._0_4_ = fVar1 * auVar64._0_4_;
      auVar85._4_4_ = fVar1 * auVar64._4_4_;
      auVar85._8_4_ = fVar1 * auVar64._8_4_;
      auVar85._12_4_ = fVar1 * auVar64._12_4_;
      auVar64 = vfmadd231ps_fma(auVar85,auVar69,local_bd0);
      auVar114._0_4_ = auVar11._0_4_ * fVar1;
      auVar114._4_4_ = auVar11._4_4_ * fVar1;
      auVar114._8_4_ = auVar11._8_4_ * fVar1;
      auVar114._12_4_ = auVar11._12_4_ * fVar1;
      auVar11 = vfmadd231ps_fma(auVar114,auVar69,local_bb0);
      auVar98._0_4_ = auVar92._0_4_ * fVar1;
      auVar98._4_4_ = auVar92._4_4_ * fVar1;
      auVar98._8_4_ = auVar92._8_4_ * fVar1;
      auVar98._12_4_ = auVar92._12_4_ * fVar1;
      auVar72 = vfmadd231ps_fma(auVar98,auVar69,local_c20);
      auVar110._0_4_ = auVar5._0_4_ * fVar1;
      auVar110._4_4_ = auVar5._4_4_ * fVar1;
      auVar110._8_4_ = auVar5._8_4_ * fVar1;
      auVar110._12_4_ = auVar5._12_4_ * fVar1;
      auVar5 = vfmadd231ps_fma(auVar110,auVar69,local_c10);
      auVar117._0_4_ = auVar80._0_4_ * fVar1;
      auVar117._4_4_ = auVar80._4_4_ * fVar1;
      auVar117._8_4_ = auVar80._8_4_ * fVar1;
      auVar117._12_4_ = auVar80._12_4_ * fVar1;
      auVar6 = vfmadd231ps_fma(auVar117,auVar69,auVar6);
      auVar80._0_4_ = fVar1 * auVar66._0_4_;
      auVar80._4_4_ = fVar1 * auVar66._4_4_;
      auVar80._8_4_ = fVar1 * auVar66._8_4_;
      auVar80._12_4_ = fVar1 * auVar66._12_4_;
      auVar92._0_4_ = auVar65._0_4_ * fVar1;
      auVar92._4_4_ = auVar65._4_4_ * fVar1;
      auVar92._8_4_ = auVar65._8_4_ * fVar1;
      auVar92._12_4_ = auVar65._12_4_ * fVar1;
      auVar66._0_4_ = auVar26._0_4_ * fVar1;
      auVar66._4_4_ = auVar26._4_4_ * fVar1;
      auVar66._8_4_ = auVar26._8_4_ * fVar1;
      auVar66._12_4_ = auVar26._12_4_ * fVar1;
      auVar65 = vfmadd231ps_fma(auVar80,auVar69,auVar8);
      auVar26 = vfmadd231ps_fma(auVar92,auVar69,local_c30);
      lVar15 = uVar38 + 0x40 + lVar39;
      local_b20 = *(undefined8 *)(lVar15 + 0x10);
      uStack_b18 = *(undefined8 *)(lVar15 + 0x18);
      uStack_b10 = local_b20;
      uStack_b08 = uStack_b18;
      lVar39 = uVar38 + 0x50 + lVar39;
      local_b40 = *(undefined8 *)(lVar39 + 0x10);
      uStack_b38 = *(undefined8 *)(lVar39 + 0x18);
      auVar66 = vfmadd231ps_fma(auVar66,auVar69,auVar7);
      uStack_b30 = local_b40;
      uStack_b28 = uStack_b38;
      auVar76._16_16_ = auVar72;
      auVar76._0_16_ = auVar10;
      auVar83._16_16_ = auVar5;
      auVar83._0_16_ = auVar27;
      auVar118._16_16_ = auVar6;
      auVar118._0_16_ = auVar9;
      auVar71._16_16_ = auVar19;
      auVar71._0_16_ = auVar19;
      auVar73._16_16_ = auVar64;
      auVar73._0_16_ = auVar64;
      auVar78._16_16_ = auVar11;
      auVar78._0_16_ = auVar11;
      auVar86._16_16_ = auVar65;
      auVar86._0_16_ = auVar65;
      auVar107._16_16_ = auVar26;
      auVar107._0_16_ = auVar26;
      auVar68._16_16_ = auVar66;
      auVar68._0_16_ = auVar66;
      auVar67 = vsubps_avx(auVar76,auVar71);
      auVar88 = vsubps_avx(auVar83,auVar73);
      auVar70 = vsubps_avx(auVar118,auVar78);
      auVar71 = vsubps_avx(auVar86,auVar76);
      auVar22 = vsubps_avx(auVar107,auVar83);
      auVar23 = vsubps_avx(auVar68,auVar118);
      auVar24._4_4_ = auVar88._4_4_ * auVar23._4_4_;
      auVar24._0_4_ = auVar88._0_4_ * auVar23._0_4_;
      auVar24._8_4_ = auVar88._8_4_ * auVar23._8_4_;
      auVar24._12_4_ = auVar88._12_4_ * auVar23._12_4_;
      auVar24._16_4_ = auVar88._16_4_ * auVar23._16_4_;
      auVar24._20_4_ = auVar88._20_4_ * auVar23._20_4_;
      auVar24._24_4_ = auVar88._24_4_ * auVar23._24_4_;
      auVar24._28_4_ = auVar66._12_4_;
      auVar64 = vfmsub231ps_fma(auVar24,auVar22,auVar70);
      auVar25._4_4_ = auVar70._4_4_ * auVar71._4_4_;
      auVar25._0_4_ = auVar70._0_4_ * auVar71._0_4_;
      auVar25._8_4_ = auVar70._8_4_ * auVar71._8_4_;
      auVar25._12_4_ = auVar70._12_4_ * auVar71._12_4_;
      auVar25._16_4_ = auVar70._16_4_ * auVar71._16_4_;
      auVar25._20_4_ = auVar70._20_4_ * auVar71._20_4_;
      auVar25._24_4_ = auVar70._24_4_ * auVar71._24_4_;
      auVar25._28_4_ = auVar19._12_4_;
      auVar5 = vfmsub231ps_fma(auVar25,auVar23,auVar67);
      uVar3 = *(undefined4 *)(ray + k * 4);
      auVar87._4_4_ = uVar3;
      auVar87._0_4_ = uVar3;
      auVar87._8_4_ = uVar3;
      auVar87._12_4_ = uVar3;
      auVar87._16_4_ = uVar3;
      auVar87._20_4_ = uVar3;
      auVar87._24_4_ = uVar3;
      auVar87._28_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar115._4_4_ = uVar3;
      auVar115._0_4_ = uVar3;
      auVar115._8_4_ = uVar3;
      auVar115._12_4_ = uVar3;
      auVar115._16_4_ = uVar3;
      auVar115._20_4_ = uVar3;
      auVar115._24_4_ = uVar3;
      auVar115._28_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar120._4_4_ = uVar3;
      auVar120._0_4_ = uVar3;
      auVar120._8_4_ = uVar3;
      auVar120._12_4_ = uVar3;
      auVar120._16_4_ = uVar3;
      auVar120._20_4_ = uVar3;
      auVar120._24_4_ = uVar3;
      auVar120._28_4_ = uVar3;
      fVar1 = *(float *)(ray + k * 4 + 0x80);
      auVar108._4_4_ = fVar1;
      auVar108._0_4_ = fVar1;
      auVar108._8_4_ = fVar1;
      auVar108._12_4_ = fVar1;
      auVar108._16_4_ = fVar1;
      auVar108._20_4_ = fVar1;
      auVar108._24_4_ = fVar1;
      auVar108._28_4_ = fVar1;
      auVar24 = vsubps_avx(auVar76,auVar87);
      fVar2 = *(float *)(ray + k * 4 + 0xa0);
      auVar113._4_4_ = fVar2;
      auVar113._0_4_ = fVar2;
      auVar113._8_4_ = fVar2;
      auVar113._12_4_ = fVar2;
      auVar113._16_4_ = fVar2;
      auVar113._20_4_ = fVar2;
      auVar113._24_4_ = fVar2;
      auVar113._28_4_ = fVar2;
      auVar25 = vsubps_avx(auVar83,auVar115);
      fVar104 = *(float *)(ray + k * 4 + 0xc0);
      auVar116._4_4_ = fVar104;
      auVar116._0_4_ = fVar104;
      auVar116._8_4_ = fVar104;
      auVar116._12_4_ = fVar104;
      auVar116._16_4_ = fVar104;
      auVar116._20_4_ = fVar104;
      auVar116._24_4_ = fVar104;
      auVar116._28_4_ = fVar104;
      auVar68 = vsubps_avx(auVar118,auVar120);
      auVar28._4_4_ = fVar1 * auVar25._4_4_;
      auVar28._0_4_ = fVar1 * auVar25._0_4_;
      auVar28._8_4_ = fVar1 * auVar25._8_4_;
      auVar28._12_4_ = fVar1 * auVar25._12_4_;
      auVar28._16_4_ = fVar1 * auVar25._16_4_;
      auVar28._20_4_ = fVar1 * auVar25._20_4_;
      auVar28._24_4_ = fVar1 * auVar25._24_4_;
      auVar28._28_4_ = auVar6._12_4_;
      auVar65 = vfmsub231ps_fma(auVar28,auVar24,auVar113);
      auVar29._4_4_ = auVar23._4_4_ * auVar65._4_4_;
      auVar29._0_4_ = auVar23._0_4_ * auVar65._0_4_;
      auVar29._8_4_ = auVar23._8_4_ * auVar65._8_4_;
      auVar29._12_4_ = auVar23._12_4_ * auVar65._12_4_;
      auVar29._16_4_ = auVar23._16_4_ * 0.0;
      auVar29._20_4_ = auVar23._20_4_ * 0.0;
      auVar29._24_4_ = auVar23._24_4_ * 0.0;
      auVar29._28_4_ = auVar23._28_4_;
      auVar119._0_4_ = auVar70._0_4_ * auVar65._0_4_;
      auVar119._4_4_ = auVar70._4_4_ * auVar65._4_4_;
      auVar119._8_4_ = auVar70._8_4_ * auVar65._8_4_;
      auVar119._12_4_ = auVar70._12_4_ * auVar65._12_4_;
      auVar119._16_4_ = auVar70._16_4_ * 0.0;
      auVar119._20_4_ = auVar70._20_4_ * 0.0;
      auVar119._24_4_ = auVar70._24_4_ * 0.0;
      auVar119._28_4_ = 0;
      auVar23._4_4_ = fVar104 * auVar24._4_4_;
      auVar23._0_4_ = fVar104 * auVar24._0_4_;
      auVar23._8_4_ = fVar104 * auVar24._8_4_;
      auVar23._12_4_ = fVar104 * auVar24._12_4_;
      auVar23._16_4_ = fVar104 * auVar24._16_4_;
      auVar23._20_4_ = fVar104 * auVar24._20_4_;
      auVar23._24_4_ = fVar104 * auVar24._24_4_;
      auVar23._28_4_ = auVar70._28_4_;
      auVar26 = vfmsub231ps_fma(auVar23,auVar68,auVar108);
      auVar65 = vfmadd231ps_fma(auVar29,ZEXT1632(auVar26),auVar22);
      auVar26 = vfmadd231ps_fma(auVar119,auVar88,ZEXT1632(auVar26));
      auVar30._4_4_ = auVar67._4_4_ * auVar22._4_4_;
      auVar30._0_4_ = auVar67._0_4_ * auVar22._0_4_;
      auVar30._8_4_ = auVar67._8_4_ * auVar22._8_4_;
      auVar30._12_4_ = auVar67._12_4_ * auVar22._12_4_;
      auVar30._16_4_ = auVar67._16_4_ * auVar22._16_4_;
      auVar30._20_4_ = auVar67._20_4_ * auVar22._20_4_;
      auVar30._24_4_ = auVar67._24_4_ * auVar22._24_4_;
      auVar30._28_4_ = auVar22._28_4_;
      auVar66 = vfmsub231ps_fma(auVar30,auVar71,auVar88);
      auVar22._4_4_ = fVar2 * auVar68._4_4_;
      auVar22._0_4_ = fVar2 * auVar68._0_4_;
      auVar22._8_4_ = fVar2 * auVar68._8_4_;
      auVar22._12_4_ = fVar2 * auVar68._12_4_;
      auVar22._16_4_ = fVar2 * auVar68._16_4_;
      auVar22._20_4_ = fVar2 * auVar68._20_4_;
      auVar22._24_4_ = fVar2 * auVar68._24_4_;
      auVar22._28_4_ = auVar88._28_4_;
      auVar6 = vfmsub231ps_fma(auVar22,auVar25,auVar116);
      fVar1 = auVar66._0_4_;
      fVar2 = auVar66._4_4_;
      auVar31._4_4_ = fVar104 * fVar2;
      auVar31._0_4_ = fVar104 * fVar1;
      fVar20 = auVar66._8_4_;
      auVar31._8_4_ = fVar104 * fVar20;
      fVar21 = auVar66._12_4_;
      auVar31._12_4_ = fVar104 * fVar21;
      auVar31._16_4_ = fVar104 * 0.0;
      auVar31._20_4_ = fVar104 * 0.0;
      auVar31._24_4_ = fVar104 * 0.0;
      auVar31._28_4_ = fVar104;
      auVar27 = vfmadd231ps_fma(auVar31,ZEXT1632(auVar5),auVar113);
      auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),ZEXT1632(auVar64),auVar108);
      auVar99._8_4_ = 0x80000000;
      auVar99._0_8_ = 0x8000000080000000;
      auVar99._12_4_ = 0x80000000;
      auVar99._16_4_ = 0x80000000;
      auVar99._20_4_ = 0x80000000;
      auVar99._24_4_ = 0x80000000;
      auVar99._28_4_ = 0x80000000;
      auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),ZEXT1632(auVar6),auVar71);
      auVar88 = vandps_avx(ZEXT1632(auVar27),auVar99);
      uVar41 = auVar88._0_4_;
      local_b00._0_4_ = (float)(uVar41 ^ auVar65._0_4_);
      uVar101 = auVar88._4_4_;
      local_b00._4_4_ = (float)(uVar101 ^ auVar65._4_4_);
      uVar102 = auVar88._8_4_;
      local_b00._8_4_ = (float)(uVar102 ^ auVar65._8_4_);
      uVar103 = auVar88._12_4_;
      local_b00._12_4_ = (float)(uVar103 ^ auVar65._12_4_);
      fVar104 = auVar88._16_4_;
      local_b00._16_4_ = fVar104;
      fVar105 = auVar88._20_4_;
      local_b00._20_4_ = fVar105;
      fVar106 = auVar88._24_4_;
      local_b00._24_4_ = fVar106;
      fStack_9a4 = auVar88._28_4_;
      local_b00._28_4_ = fStack_9a4;
      auVar65 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar67,ZEXT1632(auVar6));
      local_ae0._0_4_ = (float)(uVar41 ^ auVar65._0_4_);
      local_ae0._4_4_ = (float)(uVar101 ^ auVar65._4_4_);
      local_ae0._8_4_ = (float)(uVar102 ^ auVar65._8_4_);
      local_ae0._12_4_ = (float)(uVar103 ^ auVar65._12_4_);
      local_ae0._16_4_ = fVar104;
      local_ae0._20_4_ = fVar105;
      local_ae0._24_4_ = fVar106;
      local_ae0._28_4_ = fStack_9a4;
      auVar88 = vcmpps_avx(local_b00,ZEXT832(0) << 0x20,5);
      auVar67 = vcmpps_avx(local_ae0,ZEXT832(0) << 0x20,5);
      auVar88 = vandps_avx(auVar88,auVar67);
      auVar93._8_4_ = 0x7fffffff;
      auVar93._0_8_ = 0x7fffffff7fffffff;
      auVar93._12_4_ = 0x7fffffff;
      auVar93._16_4_ = 0x7fffffff;
      auVar93._20_4_ = 0x7fffffff;
      auVar93._24_4_ = 0x7fffffff;
      auVar93._28_4_ = 0x7fffffff;
      local_aa0 = vandps_avx(ZEXT1632(auVar27),auVar93);
      auVar67 = vcmpps_avx(ZEXT1632(auVar27),ZEXT832(0) << 0x20,4);
      auVar88 = vandps_avx(auVar88,auVar67);
      auVar111._0_4_ = local_b00._0_4_ + local_ae0._0_4_;
      auVar111._4_4_ = local_b00._4_4_ + local_ae0._4_4_;
      auVar111._8_4_ = local_b00._8_4_ + local_ae0._8_4_;
      auVar111._12_4_ = local_b00._12_4_ + local_ae0._12_4_;
      auVar111._16_4_ = fVar104 + fVar104;
      auVar111._20_4_ = fVar105 + fVar105;
      auVar111._24_4_ = fVar106 + fVar106;
      auVar111._28_4_ = fStack_9a4 + fStack_9a4;
      auVar67 = vcmpps_avx(auVar111,local_aa0,2);
      auVar70 = auVar67 & auVar88;
      if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar70 >> 0x7f,0) != '\0') ||
            (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar70 >> 0xbf,0) != '\0') ||
          (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar70[0x1f] < '\0') {
        auVar88 = vandps_avx(auVar88,auVar67);
        auVar65 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
        auVar32._4_4_ = fVar2 * auVar68._4_4_;
        auVar32._0_4_ = fVar1 * auVar68._0_4_;
        auVar32._8_4_ = fVar20 * auVar68._8_4_;
        auVar32._12_4_ = fVar21 * auVar68._12_4_;
        auVar32._16_4_ = auVar68._16_4_ * 0.0;
        auVar32._20_4_ = auVar68._20_4_ * 0.0;
        auVar32._24_4_ = auVar68._24_4_ * 0.0;
        auVar32._28_4_ = auVar68._28_4_;
        auVar26 = vfmadd213ps_fma(auVar25,ZEXT1632(auVar5),auVar32);
        auVar26 = vfmadd213ps_fma(auVar24,ZEXT1632(auVar64),ZEXT1632(auVar26));
        local_ac0._0_4_ = (float)(uVar41 ^ auVar26._0_4_);
        local_ac0._4_4_ = (float)(uVar101 ^ auVar26._4_4_);
        local_ac0._8_4_ = (float)(uVar102 ^ auVar26._8_4_);
        local_ac0._12_4_ = (float)(uVar103 ^ auVar26._12_4_);
        local_ac0._16_4_ = fVar104;
        local_ac0._20_4_ = fVar105;
        local_ac0._24_4_ = fVar106;
        local_ac0._28_4_ = fStack_9a4;
        fVar91 = *(float *)(ray + k * 4 + 0x60);
        auVar33._4_4_ = local_aa0._4_4_ * fVar91;
        auVar33._0_4_ = local_aa0._0_4_ * fVar91;
        auVar33._8_4_ = local_aa0._8_4_ * fVar91;
        auVar33._12_4_ = local_aa0._12_4_ * fVar91;
        auVar33._16_4_ = local_aa0._16_4_ * fVar91;
        auVar33._20_4_ = local_aa0._20_4_ * fVar91;
        auVar33._24_4_ = local_aa0._24_4_ * fVar91;
        auVar33._28_4_ = fVar91;
        auVar88 = vcmpps_avx(auVar33,local_ac0,1);
        fVar91 = *(float *)(ray + k * 4 + 0x100);
        auVar79 = ZEXT3264(CONCAT428(fVar91,CONCAT424(fVar91,CONCAT420(fVar91,CONCAT416(fVar91,
                                                  CONCAT412(fVar91,CONCAT48(fVar91,CONCAT44(fVar91,
                                                  fVar91))))))));
        auVar34._4_4_ = local_aa0._4_4_ * fVar91;
        auVar34._0_4_ = local_aa0._0_4_ * fVar91;
        auVar34._8_4_ = local_aa0._8_4_ * fVar91;
        auVar34._12_4_ = local_aa0._12_4_ * fVar91;
        auVar34._16_4_ = local_aa0._16_4_ * fVar91;
        auVar34._20_4_ = local_aa0._20_4_ * fVar91;
        auVar34._24_4_ = local_aa0._24_4_ * fVar91;
        auVar34._28_4_ = auVar68._28_4_;
        auVar67 = vcmpps_avx(local_ac0,auVar34,2);
        auVar88 = vandps_avx(auVar88,auVar67);
        auVar26 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
        auVar65 = vpand_avx(auVar65,auVar26);
        auVar88 = vpmovzxwd_avx2(auVar65);
        auVar88 = vpslld_avx2(auVar88,0x1f);
        if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar88 >> 0x7f,0) != '\0') ||
              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar88 >> 0xbf,0) != '\0') ||
            (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar88[0x1f] < '\0') {
          local_a20 = vpsrad_avx2(auVar88,0x1f);
          local_a80 = ZEXT1632(auVar64);
          local_a60 = ZEXT1632(auVar5);
          local_a40 = ZEXT1632(auVar66);
          auVar88 = vrcpps_avx(local_aa0);
          local_940 = local_b60;
          auVar89._8_4_ = 0x3f800000;
          auVar89._0_8_ = 0x3f8000003f800000;
          auVar89._12_4_ = 0x3f800000;
          auVar89._16_4_ = 0x3f800000;
          auVar89._20_4_ = 0x3f800000;
          auVar89._24_4_ = 0x3f800000;
          auVar89._28_4_ = 0x3f800000;
          auVar26 = vfnmadd213ps_fma(local_aa0,auVar88,auVar89);
          auVar26 = vfmadd132ps_fma(ZEXT1632(auVar26),auVar88,auVar88);
          fVar91 = auVar26._0_4_;
          fVar95 = auVar26._4_4_;
          fVar96 = auVar26._8_4_;
          fVar97 = auVar26._12_4_;
          local_9c0[0] = fVar91 * local_ac0._0_4_;
          local_9c0[1] = fVar95 * local_ac0._4_4_;
          local_9c0[2] = fVar96 * local_ac0._8_4_;
          local_9c0[3] = fVar97 * local_ac0._12_4_;
          fStack_9b0 = fVar104 * 0.0;
          fStack_9ac = fVar105 * 0.0;
          fStack_9a8 = fVar106 * 0.0;
          auVar35._4_4_ = fVar95 * local_b00._4_4_;
          auVar35._0_4_ = fVar91 * local_b00._0_4_;
          auVar35._8_4_ = fVar96 * local_b00._8_4_;
          auVar35._12_4_ = fVar97 * local_b00._12_4_;
          auVar35._16_4_ = fVar104 * 0.0;
          auVar35._20_4_ = fVar105 * 0.0;
          auVar35._24_4_ = fVar106 * 0.0;
          auVar35._28_4_ = fStack_9a4;
          auVar88 = vminps_avx(auVar35,auVar89);
          auVar36._4_4_ = fVar95 * local_ae0._4_4_;
          auVar36._0_4_ = fVar91 * local_ae0._0_4_;
          auVar36._8_4_ = fVar96 * local_ae0._8_4_;
          auVar36._12_4_ = fVar97 * local_ae0._12_4_;
          auVar36._16_4_ = fVar104 * 0.0;
          auVar36._20_4_ = fVar105 * 0.0;
          auVar36._24_4_ = fVar106 * 0.0;
          auVar36._28_4_ = fStack_9a4;
          auVar67 = vminps_avx(auVar36,auVar89);
          auVar70 = vsubps_avx(auVar89,auVar88);
          auVar71 = vsubps_avx(auVar89,auVar67);
          local_9e0 = vblendvps_avx(auVar67,auVar70,local_b60);
          local_a00 = vblendvps_avx(auVar88,auVar71,local_b60);
          fVar104 = local_b80._0_4_;
          local_9a0._0_4_ = auVar64._0_4_ * fVar104;
          fVar105 = local_b80._4_4_;
          local_9a0._4_4_ = auVar64._4_4_ * fVar105;
          fVar106 = local_b80._8_4_;
          local_9a0._8_4_ = auVar64._8_4_ * fVar106;
          fVar91 = local_b80._12_4_;
          local_9a0._12_4_ = auVar64._12_4_ * fVar91;
          fVar95 = local_b80._16_4_;
          local_9a0._16_4_ = fVar95 * 0.0;
          fVar96 = local_b80._20_4_;
          local_9a0._20_4_ = fVar96 * 0.0;
          fVar97 = local_b80._24_4_;
          local_9a0._24_4_ = fVar97 * 0.0;
          local_9a0._28_4_ = 0;
          local_980._0_4_ = fVar104 * auVar5._0_4_;
          local_980._4_4_ = fVar105 * auVar5._4_4_;
          local_980._8_4_ = fVar106 * auVar5._8_4_;
          local_980._12_4_ = fVar91 * auVar5._12_4_;
          local_980._16_4_ = fVar95 * 0.0;
          local_980._20_4_ = fVar96 * 0.0;
          local_980._24_4_ = fVar97 * 0.0;
          local_980._28_4_ = 0;
          local_960._0_4_ = fVar104 * fVar1;
          local_960._4_4_ = fVar105 * fVar2;
          local_960._8_4_ = fVar106 * fVar20;
          local_960._12_4_ = fVar91 * fVar21;
          local_960._16_4_ = fVar95 * 0.0;
          local_960._20_4_ = fVar96 * 0.0;
          local_960._24_4_ = fVar97 * 0.0;
          local_960._28_4_ = 0;
          auVar65 = vpsllw_avx(auVar65,0xf);
          auVar65 = vpacksswb_avx(auVar65,auVar65);
          uVar43 = (ulong)(byte)(SUB161(auVar65 >> 7,0) & 1 | (SUB161(auVar65 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar65 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar65 >> 0x3f,0) << 7);
          do {
            uVar48 = 0;
            for (uVar45 = uVar43; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
              uVar48 = uVar48 + 1;
            }
            uVar41 = *(uint *)((long)&local_b20 + uVar48 * 4);
            pGVar14 = (pSVar12->geometries).items[uVar41].ptr;
            if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_d00 = auVar79._0_32_;
                uVar45 = (ulong)(uint)((int)uVar48 * 4);
                uVar3 = *(undefined4 *)(local_a00 + uVar45);
                local_8c0._4_4_ = uVar3;
                local_8c0._0_4_ = uVar3;
                local_8c0._8_4_ = uVar3;
                local_8c0._12_4_ = uVar3;
                local_8c0._16_4_ = uVar3;
                local_8c0._20_4_ = uVar3;
                local_8c0._24_4_ = uVar3;
                local_8c0._28_4_ = uVar3;
                local_8a0 = *(undefined4 *)(local_9e0 + uVar45);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_9c0 + uVar45);
                local_d30.context = context->user;
                uVar3 = *(undefined4 *)((long)&local_b40 + uVar45);
                local_880._4_4_ = uVar3;
                local_880._0_4_ = uVar3;
                local_880._8_4_ = uVar3;
                local_880._12_4_ = uVar3;
                local_880._16_4_ = uVar3;
                local_880._20_4_ = uVar3;
                local_880._24_4_ = uVar3;
                local_880._28_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_9a0 + uVar45);
                uVar4 = *(undefined4 *)(local_980 + uVar45);
                local_900._4_4_ = uVar4;
                local_900._0_4_ = uVar4;
                local_900._8_4_ = uVar4;
                local_900._12_4_ = uVar4;
                local_900._16_4_ = uVar4;
                local_900._20_4_ = uVar4;
                local_900._24_4_ = uVar4;
                local_900._28_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_960 + uVar45);
                local_8e0._4_4_ = uVar4;
                local_8e0._0_4_ = uVar4;
                local_8e0._8_4_ = uVar4;
                local_8e0._12_4_ = uVar4;
                local_8e0._16_4_ = uVar4;
                local_8e0._20_4_ = uVar4;
                local_8e0._24_4_ = uVar4;
                local_8e0._28_4_ = uVar4;
                local_860._4_4_ = uVar41;
                local_860._0_4_ = uVar41;
                local_860._8_4_ = uVar41;
                local_860._12_4_ = uVar41;
                local_860._16_4_ = uVar41;
                local_860._20_4_ = uVar41;
                local_860._24_4_ = uVar41;
                local_860._28_4_ = uVar41;
                local_920[0] = (RTCHitN)(char)uVar3;
                local_920[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[4] = (RTCHitN)(char)uVar3;
                local_920[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[8] = (RTCHitN)(char)uVar3;
                local_920[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0xc] = (RTCHitN)(char)uVar3;
                local_920[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x10] = (RTCHitN)(char)uVar3;
                local_920[0x11] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x12] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x13] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x14] = (RTCHitN)(char)uVar3;
                local_920[0x15] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x16] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x17] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x18] = (RTCHitN)(char)uVar3;
                local_920[0x19] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x1a] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x1b] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x1c] = (RTCHitN)(char)uVar3;
                local_920[0x1d] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x1e] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x1f] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                uStack_89c = local_8a0;
                uStack_898 = local_8a0;
                uStack_894 = local_8a0;
                uStack_890 = local_8a0;
                uStack_88c = local_8a0;
                uStack_888 = local_8a0;
                uStack_884 = local_8a0;
                vpcmpeqd_avx2(local_8c0,local_8c0);
                uStack_83c = (local_d30.context)->instID[0];
                local_840 = uStack_83c;
                uStack_838 = uStack_83c;
                uStack_834 = uStack_83c;
                uStack_830 = uStack_83c;
                uStack_82c = uStack_83c;
                uStack_828 = uStack_83c;
                uStack_824 = uStack_83c;
                uStack_81c = (local_d30.context)->instPrimID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = uStack_81c;
                uStack_80c = uStack_81c;
                uStack_808 = uStack_81c;
                uStack_804 = uStack_81c;
                local_ce0 = local_ba0;
                local_d30.valid = (int *)local_ce0;
                local_d30.geometryUserPtr = pGVar14->userPtr;
                local_d30.hit = local_920;
                local_d30.N = 8;
                local_d30.ray = (RTCRayN *)ray;
                if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar14->occlusionFilterN)(&local_d30);
                }
                auVar67 = vpcmpeqd_avx2(local_ce0,_DAT_01f7b000);
                auVar88 = _DAT_01f7b020 & ~auVar67;
                if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar88 >> 0x7f,0) == '\0') &&
                      (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar88 >> 0xbf,0) == '\0') &&
                    (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar88[0x1f]) {
                  auVar67 = auVar67 ^ _DAT_01f7b020;
                }
                else {
                  p_Var18 = context->args->filter;
                  if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var18)(&local_d30);
                  }
                  auVar88 = vpcmpeqd_avx2(local_ce0,_DAT_01f7b000);
                  auVar67 = auVar88 ^ _DAT_01f7b020;
                  auVar74._8_4_ = 0xff800000;
                  auVar74._0_8_ = 0xff800000ff800000;
                  auVar74._12_4_ = 0xff800000;
                  auVar74._16_4_ = 0xff800000;
                  auVar74._20_4_ = 0xff800000;
                  auVar74._24_4_ = 0xff800000;
                  auVar74._28_4_ = 0xff800000;
                  auVar88 = vblendvps_avx(auVar74,*(undefined1 (*) [32])(local_d30.ray + 0x100),
                                          auVar88);
                  *(undefined1 (*) [32])(local_d30.ray + 0x100) = auVar88;
                }
                if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar67 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar67 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar67 >> 0x7f,0) == '\0') &&
                      (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar67 >> 0xbf,0) == '\0') &&
                    (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar67[0x1f]) {
                  auVar79 = ZEXT3264(local_d00);
                  *(int *)(ray + k * 4 + 0x100) = local_d00._0_4_;
                  goto LAB_0160dec6;
                }
              }
              *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
              goto LAB_0160df9f;
            }
LAB_0160dec6:
            uVar43 = uVar43 ^ 1L << (uVar48 & 0x3f);
          } while (uVar43 != 0);
        }
      }
      auVar79 = ZEXT1664(local_c40);
      auVar81 = ZEXT1664(local_c50);
      auVar84 = ZEXT1664(local_c60);
      auVar90 = ZEXT1664(local_c70);
      auVar94 = ZEXT1664(local_c80);
      auVar100 = ZEXT1664(local_c90);
      auVar109 = ZEXT1664(local_ca0);
      auVar112 = ZEXT1664(local_cb0);
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }